

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall higan::TcpServer::Start(TcpServer *this)

{
  pointer pcVar1;
  LogLevel LVar2;
  Logger local_350;
  Fmt local_138;
  string local_38;
  
  EventLoopThreadPool::Start(&this->thread_pool_);
  LVar2 = Logger::GetLogLevel();
  if ((int)LVar2 < 2) {
    Logger::Logger(&local_350,INFO,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/TcpServer.cpp"
                   ,0x1f,"Start");
    pcVar1 = (this->server_name_)._M_dataplus._M_p;
    InetAddress::GetIpPort_abi_cxx11_(&local_38,&this->server_addr_);
    Fmt::Fmt(&local_138,"server: %s, listen on %s",pcVar1,local_38._M_dataplus._M_p);
    Logger::operator<<(&local_350,&local_138);
    std::__cxx11::string::~string((string *)&local_38);
    Logger::~Logger(&local_350);
  }
  Acceptor::Listen(&this->acceptor_);
  return;
}

Assistant:

void TcpServer::Start()
{
	thread_pool_.Start();

	LOG_INFO << higan::Fmt("server: %s, listen on %s", server_name_.c_str(), server_addr_.GetIpPort().c_str());
	acceptor_.Listen();
}